

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

int __thiscall Process::open(Process *this,char *__file,int __oflag,...)

{
  String *pSVar1;
  int iVar2;
  uint in_ECX;
  String *this_00;
  Array<const_char_*> argv;
  Array<const_char_*> local_108;
  Map<String,_String> local_e8;
  
  local_108._capacity = ___oflag[2];
  local_108._begin.item = (char **)0x0;
  local_108._end.item = (char **)0x0;
  pSVar1 = (String *)*___oflag;
  for (this_00 = (String *)___oflag[1]; this_00 != pSVar1; this_00 = (String *)this_00[1]._data.str)
  {
    local_e8._end.item = (Item *)String::operator_cast_to_char_(this_00);
    Array<const_char_*>::append(&local_108,(char **)&local_e8);
  }
  local_e8._end.item = &local_e8.endItem;
  local_e8.root = (Item *)0x0;
  local_e8._size = 0;
  local_e8.endItem.key.data = &String::emptyData.super_Data;
  local_e8.endItem.value.data = &String::emptyData.super_Data;
  local_e8.endItem.parent = (Item *)0x0;
  local_e8.endItem.next = (Item *)0x0;
  local_e8.endItem.prev = (Item *)0x0;
  local_e8.freeItem = (Item *)0x0;
  local_e8.blocks = (ItemBlock *)0x0;
  local_e8._begin.item = local_e8._end.item;
  iVar2 = open(this,__file,(int)___oflag[2],local_108._begin.item,(ulong)in_ECX,&local_e8);
  Map<String,_String>::~Map(&local_e8);
  Array<const_char_*>::~Array(&local_108);
  return iVar2;
}

Assistant:

bool Process::open(const String& executable, const List<String>& args, uint streams, const Map<String, String>& environment)
{
  Array<const char*> argv(args.size());
  for (List<String>::Iterator i = args.begin(), end = args.end(); i != end; ++i)
    argv.append((const char*)*i);
  return open(executable, (int)args.size(), (char**)(const char**)argv, streams);
}